

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O1

Vec_Str_t * Acb_GeneratePatch2(Gia_Man_t *pGia,Vec_Ptr_t *vIns,Vec_Ptr_t *vOuts)

{
  char cVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  Vec_Int_t *pVVar5;
  void **ppvVar6;
  void *__ptr;
  bool bVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  Vec_Wec_t *vGates;
  ulong uVar11;
  Vec_Ptr_t *__ptr_00;
  Vec_Str_t *p;
  char *pcVar12;
  char *pcVar13;
  size_t sVar14;
  int i_8;
  int i;
  long lVar15;
  ulong uVar16;
  int i_5;
  ulong uVar17;
  long lVar18;
  
  lVar15 = 0;
  vGates = Abc_GiaSynthesize((Vec_Ptr_t *)0x0,pGia);
  uVar2 = vIns->nSize;
  uVar11 = (ulong)uVar2;
  uVar3 = vOuts->nSize;
  iVar9 = vGates->nSize;
  __ptr_00 = Acb_GenerateSignalNames2(vGates,vIns,vOuts);
  p = (Vec_Str_t *)malloc(0x10);
  p->nCap = 100;
  p->nSize = 0;
  pcVar12 = (char *)malloc(100);
  p->pArray = pcVar12;
  do {
    cVar1 = "module patch ("[lVar15];
    uVar8 = p->nCap;
    if (p->nSize == uVar8) {
      if ((int)uVar8 < 0x10) {
        if (p->pArray == (char *)0x0) {
          pcVar12 = (char *)malloc(0x10);
        }
        else {
          pcVar12 = (char *)realloc(p->pArray,0x10);
        }
        sVar14 = 0x10;
      }
      else {
        sVar14 = (ulong)uVar8 * 2;
        if ((int)sVar14 <= (int)uVar8) goto LAB_00399d85;
        if (p->pArray == (char *)0x0) {
          pcVar12 = (char *)malloc(sVar14);
        }
        else {
          pcVar12 = (char *)realloc(p->pArray,sVar14);
        }
      }
      p->pArray = pcVar12;
      p->nCap = (int)sVar14;
    }
LAB_00399d85:
    iVar4 = p->nSize;
    p->nSize = iVar4 + 1;
    p->pArray[iVar4] = cVar1;
    lVar15 = lVar15 + 1;
  } while (lVar15 != 0xe);
  if (0 < vOuts->nSize) {
    lVar15 = 0;
    do {
      pcVar12 = ",";
      if (lVar15 == 0) {
        pcVar12 = "";
      }
      Vec_StrPrintF(p,"%s %s",pcVar12,vOuts->pArray[lVar15]);
      lVar15 = lVar15 + 1;
    } while (lVar15 < vOuts->nSize);
  }
  if (0 < vIns->nSize) {
    lVar15 = 0;
    do {
      Vec_StrPrintF(p,", %s",vIns->pArray[lVar15]);
      lVar15 = lVar15 + 1;
    } while (lVar15 < vIns->nSize);
  }
  uVar8 = iVar9 - (uVar2 + uVar3);
  lVar15 = 0;
  do {
    cVar1 = "\n  );\n\n"[lVar15 + 2];
    uVar10 = p->nCap;
    if (p->nSize == uVar10) {
      if ((int)uVar10 < 0x10) {
        if (p->pArray == (char *)0x0) {
          pcVar12 = (char *)malloc(0x10);
        }
        else {
          pcVar12 = (char *)realloc(p->pArray,0x10);
        }
        sVar14 = 0x10;
      }
      else {
        sVar14 = (ulong)uVar10 * 2;
        if ((int)sVar14 <= (int)uVar10) goto LAB_00399ea2;
        if (p->pArray == (char *)0x0) {
          pcVar12 = (char *)malloc(sVar14);
        }
        else {
          pcVar12 = (char *)realloc(p->pArray,sVar14);
        }
      }
      p->pArray = pcVar12;
      p->nCap = (int)sVar14;
    }
LAB_00399ea2:
    iVar9 = p->nSize;
    p->nSize = iVar9 + 1;
    p->pArray[iVar9] = cVar1;
    lVar15 = lVar15 + 1;
  } while (lVar15 != 5);
  lVar15 = 0;
  do {
    cVar1 = "  output"[lVar15];
    uVar10 = p->nCap;
    if (p->nSize == uVar10) {
      if ((int)uVar10 < 0x10) {
        if (p->pArray == (char *)0x0) {
          pcVar12 = (char *)malloc(0x10);
        }
        else {
          pcVar12 = (char *)realloc(p->pArray,0x10);
        }
        sVar14 = 0x10;
      }
      else {
        sVar14 = (ulong)uVar10 * 2;
        if ((int)sVar14 <= (int)uVar10) goto LAB_00399f2f;
        if (p->pArray == (char *)0x0) {
          pcVar12 = (char *)malloc(sVar14);
        }
        else {
          pcVar12 = (char *)realloc(p->pArray,sVar14);
        }
      }
      p->pArray = pcVar12;
      p->nCap = (int)sVar14;
    }
LAB_00399f2f:
    iVar9 = p->nSize;
    p->nSize = iVar9 + 1;
    p->pArray[iVar9] = cVar1;
    lVar15 = lVar15 + 1;
  } while (lVar15 != 8);
  if (0 < vOuts->nSize) {
    lVar15 = 0;
    do {
      pcVar12 = ",";
      if (lVar15 == 0) {
        pcVar12 = "";
      }
      Vec_StrPrintF(p,"%s %s",pcVar12,vOuts->pArray[lVar15]);
      lVar15 = lVar15 + 1;
    } while (lVar15 < vOuts->nSize);
  }
  lVar15 = 0;
  do {
    cVar1 = " .%s(%s) ) ;\n"[lVar15 + 0xb];
    uVar10 = p->nCap;
    if (p->nSize == uVar10) {
      if ((int)uVar10 < 0x10) {
        if (p->pArray == (char *)0x0) {
          pcVar12 = (char *)malloc(0x10);
        }
        else {
          pcVar12 = (char *)realloc(p->pArray,0x10);
        }
        sVar14 = 0x10;
      }
      else {
        sVar14 = (ulong)uVar10 * 2;
        if ((int)sVar14 <= (int)uVar10) goto LAB_0039a006;
        if (p->pArray == (char *)0x0) {
          pcVar12 = (char *)malloc(sVar14);
        }
        else {
          pcVar12 = (char *)realloc(p->pArray,sVar14);
        }
      }
      p->pArray = pcVar12;
      p->nCap = (int)sVar14;
    }
LAB_0039a006:
    iVar9 = p->nSize;
    p->nSize = iVar9 + 1;
    p->pArray[iVar9] = cVar1;
    lVar15 = lVar15 + 1;
  } while (lVar15 != 2);
  lVar15 = 0;
  do {
    cVar1 = "  input"[lVar15];
    uVar10 = p->nCap;
    if (p->nSize == uVar10) {
      if ((int)uVar10 < 0x10) {
        if (p->pArray == (char *)0x0) {
          pcVar12 = (char *)malloc(0x10);
        }
        else {
          pcVar12 = (char *)realloc(p->pArray,0x10);
        }
        sVar14 = 0x10;
      }
      else {
        sVar14 = (ulong)uVar10 * 2;
        if ((int)sVar14 <= (int)uVar10) goto LAB_0039a093;
        if (p->pArray == (char *)0x0) {
          pcVar12 = (char *)malloc(sVar14);
        }
        else {
          pcVar12 = (char *)realloc(p->pArray,sVar14);
        }
      }
      p->pArray = pcVar12;
      p->nCap = (int)sVar14;
    }
LAB_0039a093:
    iVar9 = p->nSize;
    p->nSize = iVar9 + 1;
    p->pArray[iVar9] = cVar1;
    lVar15 = lVar15 + 1;
  } while (lVar15 != 7);
  if (0 < vIns->nSize) {
    lVar15 = 0;
    do {
      pcVar12 = ",";
      if (lVar15 == 0) {
        pcVar12 = "";
      }
      Vec_StrPrintF(p,"%s %s",pcVar12,vIns->pArray[lVar15]);
      lVar15 = lVar15 + 1;
    } while (lVar15 < vIns->nSize);
  }
  lVar15 = 0;
  do {
    cVar1 = " .%s(%s) ) ;\n"[lVar15 + 0xb];
    uVar10 = p->nCap;
    if (p->nSize == uVar10) {
      if ((int)uVar10 < 0x10) {
        if (p->pArray == (char *)0x0) {
          pcVar12 = (char *)malloc(0x10);
        }
        else {
          pcVar12 = (char *)realloc(p->pArray,0x10);
        }
        sVar14 = 0x10;
      }
      else {
        sVar14 = (ulong)uVar10 * 2;
        if ((int)sVar14 <= (int)uVar10) goto LAB_0039a16f;
        if (p->pArray == (char *)0x0) {
          pcVar12 = (char *)malloc(sVar14);
        }
        else {
          pcVar12 = (char *)realloc(p->pArray,sVar14);
        }
      }
      p->pArray = pcVar12;
      p->nCap = (int)sVar14;
    }
LAB_0039a16f:
    iVar9 = p->nSize;
    p->nSize = iVar9 + 1;
    p->pArray[iVar9] = cVar1;
    lVar15 = lVar15 + 1;
  } while (lVar15 != 2);
  if ((int)uVar3 < (int)uVar8) {
    lVar15 = 0;
    do {
      cVar1 = "  wire"[lVar15];
      uVar10 = p->nCap;
      if (p->nSize == uVar10) {
        if ((int)uVar10 < 0x10) {
          if (p->pArray == (char *)0x0) {
            pcVar12 = (char *)malloc(0x10);
          }
          else {
            pcVar12 = (char *)realloc(p->pArray,0x10);
          }
          sVar14 = 0x10;
        }
        else {
          sVar14 = (ulong)uVar10 * 2;
          if ((int)sVar14 <= (int)uVar10) goto LAB_0039a20a;
          if (p->pArray == (char *)0x0) {
            pcVar12 = (char *)malloc(sVar14);
          }
          else {
            pcVar12 = (char *)realloc(p->pArray,sVar14);
          }
        }
        p->pArray = pcVar12;
        p->nCap = (int)sVar14;
      }
LAB_0039a20a:
      iVar9 = p->nSize;
      p->nSize = iVar9 + 1;
      p->pArray[iVar9] = cVar1;
      lVar15 = lVar15 + 1;
    } while (lVar15 != 6);
    if (0 < (int)uVar8) {
      bVar7 = true;
      uVar16 = (ulong)uVar8;
      uVar17 = uVar11;
      do {
        if (((int)uVar2 < 0) || (__ptr_00->nSize <= (int)uVar17)) goto LAB_0039a76f;
        pcVar12 = (char *)__ptr_00->pArray[uVar17];
        iVar9 = strncmp(pcVar12,"ww",2);
        if (iVar9 == 0) {
          pcVar13 = "";
          if (!bVar7) {
            pcVar13 = ",";
          }
          bVar7 = false;
          Vec_StrPrintF(p,"%s %s",pcVar13,pcVar12);
        }
        uVar17 = uVar17 + 1;
        uVar16 = uVar16 - 1;
      } while (uVar16 != 0);
    }
    lVar15 = 0;
    do {
      cVar1 = "\n);\n\n"[lVar15 + 2];
      uVar10 = p->nCap;
      if (p->nSize == uVar10) {
        if ((int)uVar10 < 0x10) {
          if (p->pArray == (char *)0x0) {
            pcVar12 = (char *)malloc(0x10);
          }
          else {
            pcVar12 = (char *)realloc(p->pArray,0x10);
          }
          sVar14 = 0x10;
        }
        else {
          sVar14 = (ulong)uVar10 * 2;
          if ((int)sVar14 <= (int)uVar10) goto LAB_0039a31a;
          if (p->pArray == (char *)0x0) {
            pcVar12 = (char *)malloc(sVar14);
          }
          else {
            pcVar12 = (char *)realloc(p->pArray,sVar14);
          }
        }
        p->pArray = pcVar12;
        p->nCap = (int)sVar14;
      }
LAB_0039a31a:
      iVar9 = p->nSize;
      p->nSize = iVar9 + 1;
      p->pArray[iVar9] = cVar1;
      lVar15 = lVar15 + 1;
    } while (lVar15 != 3);
  }
  if (0 < (int)uVar8) {
    uVar16 = uVar11;
    do {
      if (((int)uVar2 < 0) || (vGates->nSize <= (int)uVar16)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                      ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      pVVar5 = vGates->pArray;
      if (pVVar5[uVar16].nSize < 3) {
        if (pVVar5[uVar16].nSize < 1) {
LAB_0039a7ad:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        if (1 < *pVVar5[uVar16].pArray - 7U) {
          __assert_fail("Vec_IntEntry(vGate, 0) == ABC_OPER_CONST_F || Vec_IntEntry(vGate, 0) == ABC_OPER_CONST_T"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbFunc.c"
                        ,0x870,
                        "Vec_Str_t *Acb_GeneratePatch2(Gia_Man_t *, Vec_Ptr_t *, Vec_Ptr_t *)");
        }
        Vec_StrPrintF(p,"  %s (","buf");
        if (pVVar5[uVar16].nSize < 2) goto LAB_0039a7ad;
        iVar9 = pVVar5[uVar16].pArray[1];
        if (((long)iVar9 < 0) || (__ptr_00->nSize <= iVar9)) {
LAB_0039a76f:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        Vec_StrPrintF(p," %s, ",__ptr_00->pArray[iVar9]);
        if (pVVar5[uVar16].nSize < 1) goto LAB_0039a7ad;
        Vec_StrPrintF(p," 1\'b%d",(ulong)(*pVVar5[uVar16].pArray == 8));
        Vec_StrPrintF(p," );\n");
      }
      else {
        uVar10 = *pVVar5[uVar16].pArray - 7;
        if ((0xb < uVar10) || ((0xff3U >> (uVar10 & 0x1f) & 1) == 0)) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbFunc.c"
                        ,0x66,"char *Acb_Oper2Name(int)");
        }
        Vec_StrPrintF(p,"  %s (",(&PTR_anon_var_dwarf_b9ab5_00bb2190)[uVar10]);
        if (1 < pVVar5[uVar16].nSize) {
          uVar17 = 1;
          do {
            iVar9 = pVVar5[uVar16].pArray[uVar17];
            pcVar12 = "";
            if (1 < uVar17) {
              pcVar12 = ",";
            }
            if (((long)iVar9 < 0) || (__ptr_00->nSize <= iVar9)) goto LAB_0039a76f;
            Vec_StrPrintF(p,"%s %s",pcVar12,__ptr_00->pArray[iVar9]);
            uVar17 = uVar17 + 1;
          } while ((long)uVar17 < (long)pVVar5[uVar16].nSize);
        }
        lVar15 = 0;
        do {
          cVar1 = "\n  );\n"[lVar15 + 2];
          uVar10 = p->nCap;
          if (p->nSize == uVar10) {
            if ((int)uVar10 < 0x10) {
              if (p->pArray == (char *)0x0) {
                pcVar12 = (char *)malloc(0x10);
              }
              else {
                pcVar12 = (char *)realloc(p->pArray,0x10);
              }
              sVar14 = 0x10;
            }
            else {
              sVar14 = (ulong)uVar10 * 2;
              if ((int)sVar14 <= (int)uVar10) goto LAB_0039a4a0;
              if (p->pArray == (char *)0x0) {
                pcVar12 = (char *)malloc(sVar14);
              }
              else {
                pcVar12 = (char *)realloc(p->pArray,sVar14);
              }
            }
            p->pArray = pcVar12;
            p->nCap = (int)sVar14;
          }
LAB_0039a4a0:
          iVar9 = p->nSize;
          p->nSize = iVar9 + 1;
          p->pArray[iVar9] = cVar1;
          lVar15 = lVar15 + 1;
        } while (lVar15 != 4);
      }
      uVar16 = uVar16 + 1;
    } while ((int)uVar16 < (int)(uVar8 + uVar2));
  }
  lVar15 = 0;
  do {
    cVar1 = "\nendmodule\n\n"[lVar15];
    uVar2 = p->nCap;
    if (p->nSize == uVar2) {
      if ((int)uVar2 < 0x10) {
        if (p->pArray == (char *)0x0) {
          pcVar12 = (char *)malloc(0x10);
        }
        else {
          pcVar12 = (char *)realloc(p->pArray,0x10);
        }
        sVar14 = 0x10;
      }
      else {
        sVar14 = (ulong)uVar2 * 2;
        if ((int)sVar14 <= (int)uVar2) goto LAB_0039a5e3;
        if (p->pArray == (char *)0x0) {
          pcVar12 = (char *)malloc(sVar14);
        }
        else {
          pcVar12 = (char *)realloc(p->pArray,sVar14);
        }
      }
      p->pArray = pcVar12;
      p->nCap = (int)sVar14;
    }
LAB_0039a5e3:
    iVar9 = p->nSize;
    p->nSize = iVar9 + 1;
    p->pArray[iVar9] = cVar1;
    lVar15 = lVar15 + 1;
  } while (lVar15 != 0xc);
  uVar2 = p->nCap;
  if (p->nSize == uVar2) {
    if ((int)uVar2 < 0x10) {
      if (p->pArray == (char *)0x0) {
        pcVar12 = (char *)malloc(0x10);
      }
      else {
        pcVar12 = (char *)realloc(p->pArray,0x10);
      }
      sVar14 = 0x10;
    }
    else {
      sVar14 = (ulong)uVar2 * 2;
      if ((int)sVar14 <= (int)uVar2) goto LAB_0039a670;
      if (p->pArray == (char *)0x0) {
        pcVar12 = (char *)malloc(sVar14);
      }
      else {
        pcVar12 = (char *)realloc(p->pArray,sVar14);
      }
    }
    p->pArray = pcVar12;
    p->nCap = (int)sVar14;
  }
LAB_0039a670:
  iVar9 = p->nSize;
  p->nSize = iVar9 + 1;
  p->pArray[iVar9] = '\0';
  if (__ptr_00 != (Vec_Ptr_t *)0x0) {
    iVar9 = __ptr_00->nSize;
    if (0 < (long)iVar9) {
      ppvVar6 = __ptr_00->pArray;
      lVar15 = 0;
      do {
        if ((void *)0x2 < ppvVar6[lVar15]) {
          free(ppvVar6[lVar15]);
        }
        lVar15 = lVar15 + 1;
      } while (iVar9 != lVar15);
    }
    if (__ptr_00->pArray != (void **)0x0) {
      free(__ptr_00->pArray);
      __ptr_00->pArray = (void **)0x0;
    }
    free(__ptr_00);
  }
  if (0 < vGates->nCap) {
    lVar15 = 8;
    lVar18 = 0;
    do {
      __ptr = *(void **)((long)&vGates->pArray->nCap + lVar15);
      if (__ptr != (void *)0x0) {
        free(__ptr);
        *(undefined8 *)((long)&vGates->pArray->nCap + lVar15) = 0;
      }
      lVar18 = lVar18 + 1;
      lVar15 = lVar15 + 0x10;
    } while (lVar18 < vGates->nCap);
  }
  if (vGates->pArray != (Vec_Int_t *)0x0) {
    free(vGates->pArray);
    vGates->pArray = (Vec_Int_t *)0x0;
  }
  vGates->nCap = 0;
  vGates->nSize = 0;
  free(vGates);
  printf("Synthesized patch with %d inputs, %d outputs and %d gates.\n",uVar11,(ulong)uVar3,
         (ulong)uVar8);
  return p;
}

Assistant:

Vec_Str_t * Acb_GeneratePatch2( Gia_Man_t * pGia, Vec_Ptr_t * vIns, Vec_Ptr_t * vOuts )
{
    extern Vec_Wec_t * Abc_GiaSynthesize( Vec_Ptr_t * vGias, Gia_Man_t * pMulti );
    Vec_Wec_t * vGates = Abc_GiaSynthesize( NULL, pGia );  Vec_Int_t * vGate;
    int nIns = Vec_PtrSize(vIns), nOuts = Vec_PtrSize(vOuts); char * pName;
    int i, k, iObj, nWires = Vec_WecSize(vGates) - nIns - nOuts, fFirst = 1;
    Vec_Ptr_t * vNames = Acb_GenerateSignalNames2( vGates, vIns, vOuts );

    Vec_Str_t * vStr = Vec_StrAlloc( 100 );
    Vec_StrAppend( vStr, "module patch (" );

    Vec_PtrForEachEntry( char *, vOuts, pName, i )
        Vec_StrPrintF( vStr, "%s %s", i ? ",":"", pName );
    Vec_PtrForEachEntry( char *, vIns, pName, i )
        Vec_StrPrintF( vStr, ", %s", pName );
    Vec_StrAppend( vStr, " );\n\n" );

    Vec_StrAppend( vStr, "  output" );
    Vec_PtrForEachEntry( char *, vOuts, pName, i )
        Vec_StrPrintF( vStr, "%s %s", i ? ",":"", pName );
    Vec_StrAppend( vStr, ";\n" );

    Vec_StrAppend( vStr, "  input" );
    Vec_PtrForEachEntry( char *, vIns, pName, i )
        Vec_StrPrintF( vStr, "%s %s", i ? ",":"", pName );
    Vec_StrAppend( vStr, ";\n" );

    if ( nWires > nOuts )
    {
        Vec_StrAppend( vStr, "  wire" );
        for ( i = 0; i < nWires; i++ )
        {
            char * pName = (char *)Vec_PtrEntry( vNames, nIns+i );
            if ( !strncmp(pName, "ww", 2) )
                Vec_StrPrintF( vStr, "%s %s", fFirst ? "":",", pName ), fFirst = 0;
        }
        Vec_StrAppend( vStr, ";\n\n" );
    }

    // create internal nodes
    Vec_WecForEachLevelStartStop( vGates, vGate, i, nIns, nIns+nWires )
    {
        if ( Vec_IntSize(vGate) > 2 )
        {
            Vec_StrPrintF( vStr, "  %s (", Acb_Oper2Name(Vec_IntEntry(vGate, 0)) );
            Vec_IntForEachEntryStart( vGate, iObj, k, 1 )
                Vec_StrPrintF( vStr, "%s %s", k > 1 ? ",":"", (char *)Vec_PtrEntry(vNames, iObj) );
            Vec_StrAppend( vStr, " );\n" );
        }
        else
        {
            assert( Vec_IntEntry(vGate, 0) == ABC_OPER_CONST_F || Vec_IntEntry(vGate, 0) == ABC_OPER_CONST_T );
            Vec_StrPrintF( vStr, "  %s (", Acb_Oper2Name( ABC_OPER_BIT_BUF ) );
            Vec_StrPrintF( vStr, " %s, ", (char *)Vec_PtrEntry(vNames, Vec_IntEntry(vGate, 1)) );
            Vec_StrPrintF( vStr, " 1\'b%d", Vec_IntEntry(vGate, 0) == ABC_OPER_CONST_T );
            Vec_StrPrintF( vStr, " );\n" );
        }
    }
    Vec_StrAppend( vStr, "\nendmodule\n\n" );
    Vec_StrPush( vStr, '\0' );
    Vec_PtrFreeFree( vNames );
    Vec_WecFree( vGates );

    printf( "Synthesized patch with %d inputs, %d outputs and %d gates.\n", nIns, nOuts, nWires );
    return vStr;
}